

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  IStreamingReporter *pIVar1;
  XmlReporter *in_RSI;
  ReporterConfig *in_stack_ffffffffffffffe8;
  
  pIVar1 = (IStreamingReporter *)operator_new(0x228);
  XmlReporter::XmlReporter(in_RSI,in_stack_ffffffffffffffe8);
  return pIVar1;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new T( config );
            }